

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O3

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFusion
          (RegisterLiveness *this,Loop *l1,Loop *l2,RegionRegisterLiveness *sim_result)

{
  spv_target_env sVar1;
  uint uVar2;
  Op OVar3;
  IRContext *pIVar4;
  _Hash_node_base *p_Var5;
  __node_base _Var6;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last_00;
  __node_base _Var7;
  uint32_t uVar8;
  spv_target_env sVar9;
  int32_t iVar10;
  RegionRegisterLiveness *pRVar11;
  const_iterator cVar12;
  BasicBlock *pBVar13;
  ulong uVar14;
  _Hash_node_base *p_Var15;
  long lVar16;
  BasicBlock *__range3;
  __node_base _Var17;
  __hashtable *__h;
  opt *this_00;
  IRContext *in_R9;
  undefined8 *puVar18;
  Instruction *insn;
  Instruction *pIVar19;
  __hashtable *__h_2;
  anon_class_16_2_f9f0633a_for_predicate_ predicate;
  anon_class_16_2_f9f0633a_for_predicate_ predicate_00;
  LiveSet *__range2;
  LiveSet l1_latch_live_out;
  __node_gen_type __node_gen;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_158;
  _AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
  local_120;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_118;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_f8;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(sim_result);
  pRVar11 = Get(this,l1->loop_header_);
  if (pRVar11 != sim_result) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)sim_result,
               (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)pRVar11);
  }
  pRVar11 = Get(this,l2->loop_header_);
  p_Var15 = (pRVar11->live_in_)._M_h._M_before_begin._M_nxt;
  local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)sim_result;
  if (p_Var15 != (_Hash_node_base *)0x0) {
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)sim_result,p_Var15 + 1,&local_118);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(l2,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_68);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var17._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
           *(undefined4 *)&_Var17._M_nxt[1]._M_nxt;
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->block_pressure_)._M_h,(key_type *)&local_118);
      lVar16 = (long)cVar12.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                     ._M_cur + 0x10;
      if (cVar12.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        lVar16 = 0;
      }
      local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&sim_result->live_out_;
      for (puVar18 = *(undefined8 **)(lVar16 + 0x10); puVar18 != (undefined8 *)0x0;
          puVar18 = (undefined8 *)*puVar18) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&sim_result->live_out_,puVar18 + 1,&local_118);
      }
      _Var17._M_nxt = (_Var17._M_nxt)->_M_nxt;
    } while (_Var17._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var15 = (sim_result->live_out_)._M_h._M_before_begin._M_nxt;
  if (p_Var15 != (_Hash_node_base *)0x0) {
    do {
      pIVar19 = (Instruction *)p_Var15[1]._M_nxt;
      RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar19);
      uVar8 = 0;
      if (pIVar19->has_result_id_ == true) {
        uVar8 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
      }
      local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar8);
      local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&local_a0;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_a0,&local_158,&local_118);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  p_Var15 = (sim_result->live_in_)._M_h._M_before_begin._M_nxt;
  if (p_Var15 == (_Hash_node_base *)0x0) {
    this_00 = (opt *)0x0;
  }
  else {
    do {
      pIVar19 = (Instruction *)p_Var15[1]._M_nxt;
      sVar9 = SPV_ENV_UNIVERSAL_1_0;
      if (pIVar19->has_result_id_ == true) {
        sVar9 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
      }
      if (local_a0._M_buckets[(ulong)sVar9 % local_a0._M_bucket_count] != (__node_base_ptr)0x0) {
        in_R9 = (IRContext *)local_a0._M_buckets[(ulong)sVar9 % local_a0._M_bucket_count]->_M_nxt;
        sVar1 = *(spv_target_env *)&((Loop *)in_R9)->loop_header_;
        while (sVar9 != sVar1) {
          in_R9 = ((Loop *)in_R9)->context_;
          if ((in_R9 == (IRContext *)0x0) ||
             (sVar1 = (in_R9->grammar_).target_env_,
             (ulong)sVar1 % local_a0._M_bucket_count != (ulong)sVar9 % local_a0._M_bucket_count))
          goto LAB_005fd906;
        }
        RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar19);
        uVar8 = 0;
        if (pIVar19->has_result_id_ == true) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
        }
        local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar8);
        local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
             (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
             (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&local_a0;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a0,&local_158,&local_118);
      }
LAB_005fd906:
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
    this_00 = (opt *)(sim_result->live_in_)._M_h._M_before_begin._M_nxt;
  }
  sim_result->used_registers_ = 0;
  predicate.l2 = (Loop *)in_R9;
  predicate.l1 = l2;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_118,this_00,(_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate);
  predicate_00.l2 = (Loop *)in_R9;
  predicate_00.l1 = l2;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_f8,(opt *)0x0,(_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate_00);
  p_Var15 = (l1->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var15 != (_Hash_node_base *)0x0) {
    do {
      uVar8 = *(uint32_t *)&p_Var15[1]._M_nxt;
      pIVar4 = this->context_;
      if ((pIVar4->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar4);
      }
      pBVar13 = CFG::block((pIVar4->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar8);
      local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar8);
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->block_pressure_)._M_h,(key_type *)&local_158);
      if (cVar12.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x18c,
                      "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                     );
      }
      local_158._M_buckets = (__buckets_ptr)0x0;
      local_158._M_bucket_count =
           *(size_type *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x50);
      local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_158._M_element_count =
           *(size_type *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x60);
      local_158._M_rehash_policy._0_8_ =
           *(undefined8 *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x68);
      local_158._M_rehash_policy._M_next_resize =
           *(size_t *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x70);
      local_158._M_single_bucket = (__node_base_ptr)0x0;
      local_d8._M_buckets = (__buckets_ptr)&local_158;
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_158,
                 (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)cVar12.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                           ._M_cur + 0x48),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
                  *)&local_d8);
      __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_118.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first.predicate_.l1 = local_118.predicate_.l1;
      __first.predicate_.l2 = local_118.predicate_.l2;
      __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_f8.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_f8.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last.predicate_.l1 = local_f8.predicate_.l1;
      __last.predicate_.l2 = local_f8.predicate_.l2;
      std::
      unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
      ::
      insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
                ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                  *)&local_158,__first,__last);
      uVar14 = (local_158._M_element_count +
               *(long *)((long)cVar12.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                               ._M_cur + 0x80)) -
               *(long *)((long)cVar12.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                               ._M_cur + 0x60);
      if (uVar14 < sim_result->used_registers_) {
        uVar14 = sim_result->used_registers_;
      }
      sim_result->used_registers_ = uVar14;
      for (pIVar19 = (pBVar13->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar19 != &(pBVar13->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        OVar3 = pIVar19->opcode_;
        if ((((OVar3 != OpPhi) && (OVar3 != OpUndef)) && (pIVar19->has_result_id_ != false)) &&
           ((iVar10 = spvOpcodeIsConstant(OVar3), iVar10 == 0 && (pIVar19->opcode_ != OpLabel)))) {
          uVar14 = 0;
          if (pIVar19->has_result_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
            uVar14 = (ulong)uVar8;
          }
          if (local_a0._M_buckets[uVar14 % local_a0._M_bucket_count] != (__node_base_ptr)0x0) {
            p_Var5 = local_a0._M_buckets[uVar14 % local_a0._M_bucket_count]->_M_nxt;
            uVar2 = *(uint *)&p_Var5[1]._M_nxt;
            do {
              if ((uint)uVar14 == uVar2) goto LAB_005fdb4a;
              p_Var5 = p_Var5->_M_nxt;
            } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                    (uVar2 = *(uint *)&p_Var5[1]._M_nxt,
                    (ulong)uVar2 % local_a0._M_bucket_count == uVar14 % local_a0._M_bucket_count));
          }
          RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar19);
        }
LAB_005fdb4a:
      }
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_158);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  pIVar19 = (l1->loop_latch_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar19->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
  }
  local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar8);
  cVar12 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->block_pressure_)._M_h,(key_type *)&local_158);
  if (cVar12.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("l1_latch_live_inout_info != nullptr && \"Basic block not processed\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                  ,0x19f,
                  "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                 );
  }
  local_158._M_buckets = (__buckets_ptr)0x0;
  local_158._M_bucket_count =
       *(size_type *)
        ((long)cVar12.
               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
               ._M_cur + 0x50);
  local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158._M_element_count =
       *(size_type *)
        ((long)cVar12.
               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
               ._M_cur + 0x60);
  local_158._M_rehash_policy._0_8_ =
       *(undefined8 *)
        ((long)cVar12.
               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
               ._M_cur + 0x68);
  local_158._M_rehash_policy._M_next_resize =
       *(size_t *)
        ((long)cVar12.
               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
               ._M_cur + 0x70);
  local_158._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._M_buckets = (__buckets_ptr)&local_158;
  std::
  _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
            ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_158,
             (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)((long)cVar12.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                       ._M_cur + 0x48),
             (_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
              *)&local_d8);
  __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_118.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_118.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.predicate_.l1 = local_118.predicate_.l1;
  __first_00.predicate_.l2 = local_118.predicate_.l2;
  __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_f8.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_f8.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_00.predicate_.l1 = local_f8.predicate_.l1;
  __last_00.predicate_.l2 = local_f8.predicate_.l2;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)&local_158,__first_00,__last_00);
  _Var7._M_nxt = local_158._M_before_begin._M_nxt;
  p_Var15 = (l2->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var15 != (_Hash_node_base *)0x0) {
    do {
      uVar8 = *(uint32_t *)&p_Var15[1]._M_nxt;
      pIVar4 = this->context_;
      if ((pIVar4->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar4);
      }
      pBVar13 = CFG::block((pIVar4->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar8);
      local_d8._M_buckets = (__buckets_ptr)CONCAT44(local_d8._M_buckets._4_4_,uVar8);
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->block_pressure_)._M_h,(key_type *)&local_d8);
      if (cVar12.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x1ab,
                      "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                     );
      }
      local_d8._M_buckets = (__buckets_ptr)0x0;
      local_d8._M_bucket_count =
           *(size_type *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x50);
      local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d8._M_element_count =
           *(size_type *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x60);
      local_d8._M_rehash_policy._0_8_ =
           *(undefined8 *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x68);
      local_d8._M_rehash_policy._M_next_resize =
           *(size_t *)
            ((long)cVar12.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x70);
      local_d8._M_single_bucket = (__node_base_ptr)0x0;
      local_120._M_h = (__hashtable_alloc *)&local_d8;
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_d8,
                 (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)cVar12.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                           ._M_cur + 0x48),&local_120);
      local_120._M_h = (__hashtable_alloc *)&local_d8;
      for (_Var6._M_nxt = _Var7._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
          _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_d8,_Var6._M_nxt + 1,&local_120);
      }
      uVar14 = (local_d8._M_element_count +
               *(long *)((long)cVar12.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                               ._M_cur + 0x80)) -
               *(long *)((long)cVar12.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                               ._M_cur + 0x60);
      if (uVar14 < sim_result->used_registers_) {
        uVar14 = sim_result->used_registers_;
      }
      sim_result->used_registers_ = uVar14;
      for (pIVar19 = (pBVar13->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar19 != &(pBVar13->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        OVar3 = pIVar19->opcode_;
        if ((((OVar3 != OpPhi) && (OVar3 != OpUndef)) && (pIVar19->has_result_id_ != false)) &&
           ((iVar10 = spvOpcodeIsConstant(OVar3), iVar10 == 0 && (pIVar19->opcode_ != OpLabel)))) {
          uVar14 = 0;
          if (pIVar19->has_result_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
            uVar14 = (ulong)uVar8;
          }
          if (local_a0._M_buckets[uVar14 % local_a0._M_bucket_count] != (__node_base_ptr)0x0) {
            p_Var5 = local_a0._M_buckets[uVar14 % local_a0._M_bucket_count]->_M_nxt;
            uVar2 = *(uint *)&p_Var5[1]._M_nxt;
            do {
              if ((uint)uVar14 == uVar2) goto LAB_005fde2e;
              p_Var5 = p_Var5->_M_nxt;
            } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                    (uVar2 = *(uint *)&p_Var5[1]._M_nxt,
                    (ulong)uVar2 % local_a0._M_bucket_count == uVar14 % local_a0._M_bucket_count));
          }
          RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar19);
        }
LAB_005fde2e:
      }
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_d8);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_158);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void RegisterLiveness::SimulateFusion(
    const Loop& l1, const Loop& l2, RegionRegisterLiveness* sim_result) const {
  sim_result->Clear();

  // Compute the live-in state:
  //   sim_result.live_in = l1.live_in U l2.live_in
  // This assumes that |l1| does not generated register that is live-out for
  // |l1|.
  const RegionRegisterLiveness* l1_header_live_inout = Get(l1.GetHeaderBlock());
  sim_result->live_in_ = l1_header_live_inout->live_in_;

  const RegionRegisterLiveness* l2_header_live_inout = Get(l2.GetHeaderBlock());
  sim_result->live_in_.insert(l2_header_live_inout->live_in_.begin(),
                              l2_header_live_inout->live_in_.end());

  // The live-out set of the fused loop is the l2 live-out set.
  std::unordered_set<uint32_t> exit_blocks;
  l2.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                 live_inout->live_in_.end());
  }

  // Compute the register usage information.
  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : sim_result->live_out_) {
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : sim_result->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  sim_result->used_registers_ = 0;

  // The loop fusion is injecting the l1 before the l2, the latch of l1 will be
  // connected to the header of l2.
  // To compute the register usage, we inject the loop live-in (union of l1 and
  // l2 live-in header blocks) into the live in/out of each basic block of
  // l1 to get the peak register usage. We then repeat the operation to for l2
  // basic blocks but in this case we inject the live-out of the latch of l1.
  auto live_loop = MakeFilterIteratorRange(
      sim_result->live_in_.begin(), sim_result->live_in_.end(),
      [&l1, &l2](Instruction* insn) {
        BasicBlock* bb = insn->context()->get_instr_block(insn);
        return insn->HasResultId() &&
               !(insn->opcode() == spv::Op::OpPhi &&
                 (bb == l1.GetHeaderBlock() || bb == l2.GetHeaderBlock()));
      });

  for (uint32_t bb_id : l1.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop.begin(), live_loop.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }

  const RegionRegisterLiveness* l1_latch_live_inout_info =
      Get(l1.GetLatchBlock()->id());
  assert(l1_latch_live_inout_info != nullptr && "Basic block not processed");
  RegionRegisterLiveness::LiveSet l1_latch_live_out =
      l1_latch_live_inout_info->live_out_;
  l1_latch_live_out.insert(live_loop.begin(), live_loop.end());

  auto live_loop_l2 =
      make_range(l1_latch_live_out.begin(), l1_latch_live_out.end());

  for (uint32_t bb_id : l2.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop_l2.begin(), live_loop_l2.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }
}